

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

Mat * ncnn::Mat::from_pixels_resize
                (uchar *pixels,int type,int w,int h,int stride,int target_width,int target_height,
                Allocator *allocator)

{
  int in_ECX;
  uint in_EDX;
  undefined8 in_RSI;
  Mat *in_RDI;
  int in_R8D;
  undefined4 in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000064;
  uchar *in_stack_00000068;
  int in_stack_00000074;
  int in_stack_00000078;
  int in_stack_0000007c;
  uchar *in_stack_00000080;
  int in_stack_00000090;
  int in_stack_00000098;
  Mat dst_2;
  Mat dst_1;
  Mat dst;
  int type_from;
  undefined8 in_stack_fffffffffffffe58;
  int _elempack;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  int _h;
  undefined8 in_stack_fffffffffffffe68;
  int _w;
  Mat *in_stack_fffffffffffffe70;
  Mat *this;
  undefined8 in_stack_fffffffffffffe78;
  int iVar1;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  undefined8 in_stack_fffffffffffffe90;
  uchar *in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  Mat local_f8;
  Mat local_b8;
  Mat local_68;
  uint local_24;
  undefined4 local_20;
  int local_1c;
  int local_18;
  int iStack_c;
  
  iStack_c = (int)((ulong)in_RSI >> 0x20);
  iVar1 = (int)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  if ((in_ECX == in_stack_00000008) && (in_R8D == in_stack_00000010)) {
    from_pixels(in_stack_fffffffffffffe98,(int)((ulong)in_stack_fffffffffffffe90 >> 0x20),
                (int)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88,
                (Allocator *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  }
  else {
    local_24 = in_EDX & 0xffff;
    _h = (int)in_stack_fffffffffffffe68;
    _w = (int)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    _elempack = (int)((ulong)in_stack_fffffffffffffe58 >> 0x20);
    if ((local_24 == 1) || (local_24 == 2)) {
      Mat(in_stack_fffffffffffffe70,_w,_h,
          CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),_elempack,
          (Allocator *)0x15f6cd);
      operator_cast_to_unsigned_char_(&local_68);
      resize_bilinear_c3(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000074,
                         in_stack_00000068,in_stack_00000064,in_stack_00000090,in_stack_00000098);
      operator_cast_to_unsigned_char_(&local_68);
      from_pixels((uchar *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                  in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,iVar1,
                  (Allocator *)in_stack_fffffffffffffe70);
      ~Mat((Mat *)0x15f7bb);
    }
    else if (local_24 == 3) {
      Mat(in_stack_fffffffffffffe70,_w,_h,
          CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),_elempack,
          (Allocator *)0x15f824);
      operator_cast_to_unsigned_char_(&local_b8);
      resize_bilinear_c1(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000074,
                         in_stack_00000068,in_stack_00000064,in_stack_00000090,in_stack_00000098);
      operator_cast_to_unsigned_char_(&local_b8);
      from_pixels((uchar *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                  in_stack_fffffffffffffe84,in_stack_fffffffffffffe80,iVar1,
                  (Allocator *)in_stack_fffffffffffffe70);
      ~Mat((Mat *)0x15f8ed);
    }
    else if ((local_24 == 4) || (local_24 == 5)) {
      this = &local_f8;
      local_20 = in_R9D;
      local_1c = in_R8D;
      local_18 = in_ECX;
      Mat(this,_w,_h,CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),_elempack,
          (Allocator *)0x15f960);
      iVar1 = iStack_c;
      operator_cast_to_unsigned_char_(this);
      resize_bilinear_c4(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000074,
                         in_stack_00000068,in_stack_00000064,in_stack_00000090,in_stack_00000098);
      operator_cast_to_unsigned_char_(&local_f8);
      from_pixels((uchar *)CONCAT44(local_20,local_1c),local_18,in_stack_fffffffffffffe80,iVar1,
                  (Allocator *)this);
      ~Mat((Mat *)0x15fa30);
    }
    else {
      Mat(in_RDI);
    }
  }
  return in_RDI;
}

Assistant:

Mat Mat::from_pixels_resize(const unsigned char* pixels, int type, int w, int h, int stride, int target_width, int target_height, Allocator* allocator)
{
    if (w == target_width && h == target_height)
        return Mat::from_pixels(pixels, type, w, h, stride, allocator);

    int type_from = type & PIXEL_FORMAT_MASK;

    if (type_from == PIXEL_RGB || type_from == PIXEL_BGR)
    {
        Mat dst(target_width, target_height, (size_t)3u, 3);
        resize_bilinear_c3(pixels, w, h, stride, dst, target_width, target_height, target_width * 3);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_GRAY)
    {
        Mat dst(target_width, target_height, (size_t)1u, 1);
        resize_bilinear_c1(pixels, w, h, stride, dst, target_width, target_height, target_width * 1);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }
    else if (type_from == PIXEL_RGBA || type_from == PIXEL_BGRA)
    {
        Mat dst(target_width, target_height, (size_t)4u, 4);
        resize_bilinear_c4(pixels, w, h, stride, dst, target_width, target_height, target_width * 4);

        return Mat::from_pixels(dst, type, target_width, target_height, allocator);
    }

    // unknown convert type
    return Mat();
}